

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseRandomPick(FScanner *sc,FName *identifier,PClassActor *cls)

{
  undefined8 r;
  bool floaty_00;
  bool bVar1;
  FxRandomPick *this;
  FScriptPosition local_68;
  FxExpression *local_58;
  FxExpression *expr;
  int index;
  undefined1 local_40 [8];
  TArray<FxExpression_*,_FxExpression_*> list;
  FRandom *rng;
  bool floaty;
  PClassActor *cls_local;
  FName *identifier_local;
  FScanner *sc_local;
  
  floaty_00 = FName::operator==(identifier,NAME_FRandomPick);
  TArray<FxExpression_*,_FxExpression_*>::TArray((TArray<FxExpression_*,_FxExpression_*> *)local_40)
  ;
  TArray<FxExpression_*,_FxExpression_*>::Clear((TArray<FxExpression_*,_FxExpression_*> *)local_40);
  expr._0_4_ = 0;
  list._8_8_ = ParseRNG(sc);
  FScanner::MustGetToken(sc,0x28);
  while( true ) {
    local_58 = ParseExpressionM(sc,cls);
    TArray<FxExpression_*,_FxExpression_*>::Push
              ((TArray<FxExpression_*,_FxExpression_*> *)local_40,&local_58);
    bVar1 = FScanner::CheckToken(sc,0x29);
    if (bVar1) break;
    FScanner::MustGetToken(sc,0x2c);
  }
  this = (FxRandomPick *)operator_new(0x50);
  r = list._8_8_;
  FScriptPosition::FScriptPosition(&local_68,sc);
  FxRandomPick::FxRandomPick
            (this,(FRandom *)r,(TArray<FxExpression_*,_FxExpression_*> *)local_40,floaty_00,
             &local_68);
  FScriptPosition::~FScriptPosition(&local_68);
  TArray<FxExpression_*,_FxExpression_*>::~TArray
            ((TArray<FxExpression_*,_FxExpression_*> *)local_40);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseRandomPick(FScanner &sc, FName identifier, PClassActor *cls)
{
	bool floaty = identifier == NAME_FRandomPick;
	FRandom *rng;
	TArray<FxExpression*> list;
	list.Clear();
	int index = 0;

	rng = ParseRNG(sc);
	sc.MustGetToken('(');

	for (;;)
	{
		FxExpression *expr = ParseExpressionM(sc, cls);
		list.Push(expr);
		if (sc.CheckToken(')'))
			break;
		sc.MustGetToken(',');
	}
	return new FxRandomPick(rng, list, floaty, sc);
}